

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O3

void __thiscall
YAML::Utils::anon_unknown_0::WriteDoubleQuoteEscapeSequence
          (anon_unknown_0 *this,ostream_wrapper *out,int codePoint,value stringEscapingStyle)

{
  uint uVar1;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  size_t sVar2;
  undefined7 uVar3;
  uint uVar4;
  int __fd;
  uint uVar5;
  int iVar6;
  undefined8 uStack_38;
  
  sVar2 = CONCAT44(in_register_0000000c,stringEscapingStyle);
  uVar4 = (uint)out;
  uStack_38 = in_RAX;
  ostream_wrapper::write((ostream_wrapper *)this,0x75c1f2,(void *)0x1,sVar2);
  uVar3 = (undefined7)(sVar2 >> 8);
  sVar2 = CONCAT71(uVar3,codePoint != 2);
  if ((int)uVar4 < 0xff && codePoint != 2) {
    iVar6 = 2;
    __fd = 0x753ccc;
  }
  else {
    sVar2 = CONCAT71(uVar3,0xfffe < (int)uVar4);
    __fd = 0x74cd08;
    if ((int)uVar4 < 0xffff) {
      __fd = 0x75b345;
    }
    if ((int)uVar4 < 0xffff || codePoint != 2) {
      iVar6 = (uint)(0xfffe < (int)uVar4) * 4 + 4;
    }
    else {
      WriteDoubleQuoteEscapeSequence
                (this,(ostream_wrapper *)
                      (ulong)((uint)(((ulong)out & 0xffffffff) >> 10) & 0xffff | 0xd7c0),2,
                 (value)sVar2);
      ostream_wrapper::write((ostream_wrapper *)this,0x75c1f2,(void *)0x1,sVar2);
      uVar4 = uVar4 & 0x3ff | 0xdc00;
      iVar6 = 4;
      __fd = 0x75b345;
    }
  }
  ostream_wrapper::write((ostream_wrapper *)this,__fd,(void *)0x1,sVar2);
  uVar5 = iVar6 + 1;
  uVar1 = iVar6 * 4;
  do {
    uVar1 = uVar1 - 4;
    uStack_38 = CONCAT17("0123456789abcdef"[(int)uVar4 >> ((byte)uVar1 & 0x1f) & 0xf],
                         (undefined7)uStack_38);
    ostream_wrapper::write((ostream_wrapper *)this,(int)&uStack_38 + 7,(void *)0x1,(ulong)uVar1);
    uVar5 = uVar5 - 1;
  } while (1 < uVar5);
  return;
}

Assistant:

void WriteDoubleQuoteEscapeSequence(ostream_wrapper& out, int codePoint, StringEscaping::value stringEscapingStyle) {
  static const char hexDigits[] = "0123456789abcdef";

  out << "\\";
  int digits = 8;
  if (codePoint < 0xFF && stringEscapingStyle != StringEscaping::JSON) {
    out << "x";
    digits = 2;
  } else if (codePoint < 0xFFFF) {
    out << "u";
    digits = 4;
  } else if (stringEscapingStyle != StringEscaping::JSON) {
    out << "U";
    digits = 8;
  } else {
    auto surrogatePair = EncodeUTF16SurrogatePair(codePoint);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.first, stringEscapingStyle);
    WriteDoubleQuoteEscapeSequence(out, surrogatePair.second, stringEscapingStyle);
    return;
  }

  // Write digits into the escape sequence
  for (; digits > 0; --digits)
    out << hexDigits[(codePoint >> (4 * (digits - 1))) & 0xF];
}